

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O0

REF_STATUS ref_metric_olympic_node(REF_NODE ref_node,REF_DBL h)

{
  uint uVar1;
  double dVar2;
  double local_50;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL hh;
  REF_INT node;
  REF_DBL h_local;
  REF_NODE ref_node_local;
  
  hh._4_4_ = 0;
  do {
    if (ref_node->max <= hh._4_4_) {
      return 0;
    }
    if (((-1 < hh._4_4_) && (hh._4_4_ < ref_node->max)) && (-1 < ref_node->global[hh._4_4_])) {
      if (ref_node->real[hh._4_4_ * 0xf + 2] - 0.5 <= 0.0) {
        local_50 = -(ref_node->real[hh._4_4_ * 0xf + 2] - 0.5);
      }
      else {
        local_50 = ref_node->real[hh._4_4_ * 0xf + 2] - 0.5;
      }
      dVar2 = h + ((0.1 - h) * local_50) / 0.5;
      uVar1 = ref_node_metric_form
                        (ref_node,hh._4_4_,99.99999999999999,0.0,0.0,99.99999999999999,0.0,
                         1.0 / (dVar2 * dVar2));
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0x58,"ref_metric_olympic_node",(ulong)uVar1,"set node met");
        return uVar1;
      }
    }
    hh._4_4_ = hh._4_4_ + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_metric_olympic_node(REF_NODE ref_node, REF_DBL h) {
  REF_INT node;
  REF_DBL hh;

  each_ref_node_valid_node(ref_node, node) {
    hh = h + (0.1 - h) * ABS(ref_node_xyz(ref_node, 2, node) - 0.5) / 0.5;
    RSS(ref_node_metric_form(ref_node, node, 1.0 / (0.1 * 0.1), 0, 0,
                             1.0 / (0.1 * 0.1), 0, 1.0 / (hh * hh)),
        "set node met");
  }

  return REF_SUCCESS;
}